

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printRemainingMessages
          (TapAssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  ColourImpl *pCVar2;
  MessageInfo *pMVar3;
  pointer pMVar4;
  ostream *poVar5;
  undefined4 in_register_00000034;
  char local_49;
  pluralise local_48;
  
  pMVar4 = (this->itMessage)._M_current;
  pMVar1 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    poVar5 = this->stream;
    pCVar2 = this->colourImpl;
    (*pCVar2->_vptr_ColourImpl[2])(pCVar2,CONCAT44(in_register_00000034,colour));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ",6);
    local_48.m_count = ((long)pMVar1 - (long)pMVar4 >> 3) * -0x71c71c71c71c71c7;
    local_48.m_label.m_start = "message";
    local_48.m_label.m_size = 7;
    operator<<(poVar5,&local_48);
    local_49 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_49,1);
    (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0);
    pMVar4 = (this->itMessage)._M_current;
    if (pMVar4 != pMVar1) {
      do {
        if ((this->printInfoMessages != false) || (pMVar4->type != Info)) {
          poVar5 = this->stream;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," \'",2);
          pMVar3 = (this->itMessage)._M_current;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(pMVar3->message)._M_dataplus._M_p,
                              (pMVar3->message)._M_string_length);
          local_48.m_count = CONCAT71(local_48.m_count._1_7_,0x27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
          pMVar4 = (this->itMessage)._M_current + 1;
          (this->itMessage)._M_current = pMVar4;
          if (pMVar4 != pMVar1) {
            poVar5 = this->stream;
            pCVar2 = this->colourImpl;
            (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0x17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," and",4);
            (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0);
          }
        }
        pMVar4 = (this->itMessage)._M_current;
      } while (pMVar4 != pMVar1);
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = tapDimColour) {
                if (itMessage == messages.end()) {
                    return;
                }

                // using messages.end() directly (or auto) yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>(itEnd - itMessage);

                stream << colourImpl->guardColour( colour ) << " with "
                       << pluralise( N, "message"_sr ) << ':';

                for (; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if (printInfoMessages || itMessage->type != ResultWas::Info) {
                        stream << " '" << itMessage->message << '\'';
                        if (++itMessage != itEnd) {
                            stream << colourImpl->guardColour(tapDimColour) << " and";
                        }
                    }
                }
            }